

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
UA_Client_NamespaceGetIndex(UA_Client *client,UA_String *namespaceUri,UA_UInt16 *namespaceIndex)

{
  long lVar1;
  size_t __n;
  int iVar2;
  undefined8 *puVar3;
  long lVar4;
  UA_StatusCode UVar5;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined2 *local_140;
  undefined2 local_138;
  undefined2 uStack_136;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined1 local_e8 [8];
  UA_ReadResponse response;
  
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_140 = &local_138;
  local_128 = 0;
  uStack_136 = 0;
  uStack_12c = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_f8 = 0;
  uStack_120 = 0xd;
  local_138 = 0;
  uStack_134 = 0;
  uStack_130 = 0x8cf;
  local_148 = 1;
  __UA_Client_Service(client,&local_1c8,UA_TYPES + 0x87,local_e8,UA_TYPES + 0x85);
  UVar5 = response.responseHeader.timestamp._4_4_;
  if ((((response.responseHeader.timestamp._4_4_ == 0) &&
       (UVar5 = 0x80620000,
       response.responseHeader.additionalHeader.content.encoded.body.data == (UA_Byte *)0x1)) &&
      ((*(byte *)response.resultsSize & 1) != 0)) &&
     (UVar5 = 0x80740000, *(long *)(response.resultsSize + 8) == 0x13e5c0)) {
    lVar1 = *(long *)(response.resultsSize + 0x18);
    UVar5 = 0x803e0000;
    if (lVar1 != 0) {
      __n = namespaceUri->length;
      puVar3 = (undefined8 *)(*(long *)(response.resultsSize + 0x20) + 8);
      lVar4 = 0;
      response.diagnosticInfos = (UA_DiagnosticInfo *)namespaceUri;
      do {
        if ((__n == puVar3[-1]) &&
           (iVar2 = bcmp(*(UA_Byte **)&((UA_DiagnosticInfo *)namespaceUri)->namespaceUri,
                         (void *)*puVar3,__n), namespaceUri = (UA_String *)response.diagnosticInfos,
           iVar2 == 0)) {
          *namespaceIndex = (UA_UInt16)lVar4;
          UVar5 = 0;
          break;
        }
        lVar4 = lVar4 + 1;
        puVar3 = puVar3 + 2;
      } while (lVar1 != lVar4);
    }
  }
  deleteMembers_noInit(local_e8,UA_TYPES + 0x85);
  return UVar5;
}

Assistant:

UA_StatusCode
UA_Client_NamespaceGetIndex(UA_Client *client, UA_String *namespaceUri,
                            UA_UInt16 *namespaceIndex) {
    UA_ReadRequest request;
    UA_ReadRequest_init(&request);
    UA_ReadValueId id;
    UA_ReadValueId_init(&id);
    id.attributeId = UA_ATTRIBUTEID_VALUE;
    id.nodeId = UA_NODEID_NUMERIC(0, UA_NS0ID_SERVER_NAMESPACEARRAY);
    request.nodesToRead = &id;
    request.nodesToReadSize = 1;

    UA_ReadResponse response = UA_Client_Service_read(client, request);

    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    if(response.responseHeader.serviceResult != UA_STATUSCODE_GOOD)
        retval = response.responseHeader.serviceResult;
    else if(response.resultsSize != 1 || !response.results[0].hasValue)
        retval = UA_STATUSCODE_BADNODEATTRIBUTESINVALID;
    else if(response.results[0].value.type != &UA_TYPES[UA_TYPES_STRING])
        retval = UA_STATUSCODE_BADTYPEMISMATCH;

    if(retval != UA_STATUSCODE_GOOD) {
        UA_ReadResponse_deleteMembers(&response);
        return retval;
    }

    retval = UA_STATUSCODE_BADNOTFOUND;
    UA_String *ns = response.results[0].value.data;
    for(size_t i = 0; i < response.results[0].value.arrayLength; ++i){
        if(UA_String_equal(namespaceUri, &ns[i])) {
            *namespaceIndex = (UA_UInt16)i;
            retval = UA_STATUSCODE_GOOD;
            break;
        }
    }

    UA_ReadResponse_deleteMembers(&response);
    return retval;
}